

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode multi_timeout(Curl_multi *multi,long *timeout_ms)

{
  Curl_tree *pCVar1;
  long lVar2;
  timeval older;
  timeval i;
  uint local_34;
  uint local_30;
  uint local_2c;
  long local_28;
  timeval now;
  long *timeout_ms_local;
  Curl_multi *multi_local;
  
  if (multi->timetree == (Curl_tree *)0x0) {
    *timeout_ms = -1;
  }
  else {
    older = curlx_tvnow();
    i.tv_usec = multi_timeout::tv_zero.tv_usec;
    i.tv_sec = multi_timeout::tv_zero.tv_sec;
    pCVar1 = Curl_splay(i,multi->timetree);
    multi->timetree = pCVar1;
    local_28 = older.tv_sec;
    if ((multi->timetree->key).tv_sec < local_28) {
      local_2c = 0xffffffff;
    }
    else {
      if (local_28 < (multi->timetree->key).tv_sec) {
        local_30 = 1;
      }
      else {
        now.tv_sec = older.tv_usec;
        if ((multi->timetree->key).tv_usec < now.tv_sec) {
          local_34 = 0xffffffff;
        }
        else {
          local_34 = (uint)(now.tv_sec < (multi->timetree->key).tv_usec);
        }
        local_30 = local_34;
      }
      local_2c = local_30;
    }
    if ((int)local_2c < 1) {
      *timeout_ms = 0;
    }
    else {
      lVar2 = curlx_tvdiff(multi->timetree->key,older);
      *timeout_ms = lVar2;
      if (*timeout_ms == 0) {
        *timeout_ms = 1;
      }
    }
  }
  return CURLM_OK;
}

Assistant:

static CURLMcode multi_timeout(struct Curl_multi *multi,
                               long *timeout_ms)
{
  static struct timeval tv_zero = {0,0};

  if(multi->timetree) {
    /* we have a tree of expire times */
    struct timeval now = Curl_tvnow();

    /* splay the lowest to the bottom */
    multi->timetree = Curl_splay(tv_zero, multi->timetree);

    if(Curl_splaycomparekeys(multi->timetree->key, now) > 0) {
      /* some time left before expiration */
      *timeout_ms = curlx_tvdiff(multi->timetree->key, now);
      if(!*timeout_ms)
        /*
         * Since we only provide millisecond resolution on the returned value
         * and the diff might be less than one millisecond here, we don't
         * return zero as that may cause short bursts of busyloops on fast
         * processors while the diff is still present but less than one
         * millisecond! instead we return 1 until the time is ripe.
         */
        *timeout_ms=1;
    }
    else
      /* 0 means immediately */
      *timeout_ms = 0;
  }
  else
    *timeout_ms = -1;

  return CURLM_OK;
}